

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::XmlReporter::benchmarkFailed(XmlReporter *this,string *error)

{
  undefined1 local_70 [16];
  undefined1 local_60 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  ostream *local_30 [2];
  
  local_40._M_allocated_capacity = (size_type)local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"failed","");
  XmlWriter::scopedElement((XmlWriter *)local_70,(string *)&this->m_xml,(XmlFormatting)&local_40);
  local_60._0_8_ = (pointer)(local_60 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"message","");
  XmlWriter::writeAttribute((XmlWriter *)local_70._0_8_,(string *)local_60,error);
  if ((pointer)local_60._0_8_ != (pointer)(local_60 + 0x10)) {
    operator_delete((void *)local_60._0_8_,(ulong)(local_60._16_8_ + 1));
  }
  XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_70);
  if ((ostream **)local_40._M_allocated_capacity != local_30) {
    operator_delete((void *)local_40._M_allocated_capacity,(ulong)(local_30[0] + 1));
  }
  XmlWriter::endElement(&this->m_xml,Newline|Indent);
  return;
}

Assistant:

void XmlReporter::benchmarkFailed(std::string const &error) {
        m_xml.scopedElement("failed").
            writeAttribute("message", error);
        m_xml.endElement();
    }